

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::Argument_Binding::set_name(Argument_Binding *this,string *value)

{
  if (this->_oneof_case_[0] != 1) {
    clear_binding(this);
    this->_oneof_case_[0] = 1;
    (this->binding_).value_ =
         (Value *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  }
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&(this->binding_).name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,value);
  return;
}

Assistant:

inline void Argument_Binding::set_name(const ::std::string& value) {
  // @@protoc_insertion_point(field_set:CoreML.Specification.MILSpec.Argument.Binding.name)
  if (!has_name()) {
    clear_binding();
    set_has_name();
    binding_.name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  }
  binding_.name_.SetNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), value);
  // @@protoc_insertion_point(field_set:CoreML.Specification.MILSpec.Argument.Binding.name)
}